

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestRegistry_runTwoTests_TestShell::createTest(TEST_TestRegistry_runTwoTests_TestShell *this)

{
  TEST_TestRegistry_runTwoTests_Test *this_00;
  TEST_TestRegistry_runTwoTests_TestShell *this_local;
  
  this_00 = (TEST_TestRegistry_runTwoTests_Test *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
                         ,0xb2);
  TEST_TestRegistry_runTwoTests_Test::TEST_TestRegistry_runTwoTests_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestRegistry, runTwoTests)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    CHECK(!test1->hasRun_);
    CHECK(!test2->hasRun_);
    myRegistry->runAllTests(*result);
    CHECK(test1->hasRun_);
    CHECK(test2->hasRun_);
}